

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryEncoder.cc
# Opt level: O3

void __thiscall avro::BinaryEncoder::setItemCount(BinaryEncoder *this,size_t count)

{
  size_t n;
  undefined8 *puVar1;
  array<unsigned_char,_10UL> bytes;
  array<unsigned_char,_10UL> local_40;
  undefined1 local_30 [16];
  
  if (count != 0) {
    n = encodeInt64(count,&local_40);
    StreamWriter::writeBytes(&this->out_,local_40.elems,n);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40.elems._0_8_ = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Count cannot be zero","");
  std::runtime_error::runtime_error((runtime_error *)(puVar1 + 1),(string *)&local_40);
  *puVar1 = 0x1cc910;
  puVar1[1] = 0x1cc940;
  __cxa_throw(puVar1,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void BinaryEncoder::setItemCount(size_t count)
{
    if (count == 0) {
        throw Exception("Count cannot be zero");
    }
    doEncodeLong(count);
}